

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O2

void prvTidyErrorSummary(TidyDocImpl *doc)

{
  uint uVar1;
  ctmbstr ptVar2;
  uint code;
  
  ptVar2 = tidyLocalizedString(0x1fe);
  uVar1 = *(int *)((doc->config).value + 8) - 2;
  if ((uVar1 < 7) && ((0x71U >> (uVar1 & 0x1f) & 1) != 0)) {
    ptVar2 = &DAT_00163444 + *(int *)(&DAT_00163444 + (ulong)uVar1 * 4);
  }
  if ((doc->badAccess & 0x20) != 0) {
    doc->badAccess = doc->badAccess & 0xffffffcf;
  }
  uVar1 = doc->badChars;
  if (uVar1 != 0) {
    if ((uVar1 & 1) != 0) {
      prvTidyDialogue(doc,0x219,ptVar2);
      uVar1 = doc->badChars;
    }
    if ((uVar1 & 0x42) != 0) {
      prvTidyDialogue(doc,0x212,ptVar2);
      uVar1 = doc->badChars;
    }
    if ((uVar1 & 4) != 0) {
      prvTidyDialogue(doc,0x20d);
      uVar1 = doc->badChars;
    }
    if ((uVar1 & 8) != 0) {
      prvTidyDialogue(doc,0x20c);
      uVar1 = doc->badChars;
    }
    if ((uVar1 & 0x20) != 0) {
      prvTidyDialogue(doc,0x20b);
    }
  }
  uVar1 = doc->badForm;
  if (uVar1 != 0) {
    if ((uVar1 & 1) != 0) {
      prvTidyDialogue(doc,0x208);
      uVar1 = doc->badForm;
    }
    if ((uVar1 & 2) != 0) {
      prvTidyDialogue(doc,0x209);
    }
  }
  uVar1 = doc->badAccess;
  if (uVar1 != 0) {
    code = 0x207;
    if ((doc->config).value[1].v == 0) {
      if ((uVar1 & 4) != 0) {
        prvTidyDialogue(doc,0x211);
        uVar1 = doc->badAccess;
      }
      if ((uVar1 & 1) != 0) {
        prvTidyDialogue(doc,0x20e);
        uVar1 = doc->badAccess;
      }
      if ((uVar1 & 8) != 0) {
        prvTidyDialogue(doc,0x20f);
        uVar1 = doc->badAccess;
      }
      if ((uVar1 & 2) != 0) {
        prvTidyDialogue(doc,0x210);
        uVar1 = doc->badAccess;
      }
      if ((uVar1 & 0x30) == 0x10) {
        prvTidyDialogue(doc,0x215);
      }
      code = 0x207 - ((doc->config).value[1].v == 0);
    }
    prvTidyDialogue(doc,code);
  }
  uVar1 = doc->badLayout;
  if (uVar1 != 0) {
    if ((uVar1 & 2) != 0) {
      prvTidyDialogue(doc,0x216);
      uVar1 = doc->badLayout;
    }
    if ((uVar1 & 1) != 0) {
      prvTidyDialogue(doc,0x218);
      uVar1 = doc->badLayout;
    }
    if ((uVar1 & 8) != 0) {
      prvTidyDialogue(doc,0x214);
      uVar1 = doc->badLayout;
    }
    if ((uVar1 & 4) != 0) {
      prvTidyDialogue(doc,0x217);
      uVar1 = doc->badLayout;
    }
    if ((uVar1 & 0x10) != 0) {
      prvTidyDialogue(doc,0x213);
    }
  }
  if ((doc->footnotes & 1) == 0) {
    return;
  }
  prvTidyDialogue(doc,0x205);
  return;
}

Assistant:

void TY_(ErrorSummary)( TidyDocImpl* doc )
{
    ctmbstr encnam = tidyLocalizedString(STRING_SPECIFIED);
    int charenc = cfg( doc, TidyCharEncoding ); 
    if ( charenc == WIN1252 ) 
        encnam = "Windows-1252";
    else if ( charenc == MACROMAN )
        encnam = "MacRoman";
    else if ( charenc == IBM858 )
        encnam = "ibm858";
    else if ( charenc == LATIN0 )
        encnam = "latin0";

    /* adjust badAccess to that it is 0 if frames are ok */
    if ( doc->badAccess & (BA_USING_FRAMES | BA_USING_NOFRAMES) )
    {
        if (!((doc->badAccess & BA_USING_FRAMES) && !(doc->badAccess & BA_USING_NOFRAMES)))
        {
            doc->badAccess &= ~(BA_USING_FRAMES | BA_USING_NOFRAMES);
        }
    }

    if (doc->badChars)
    {
        if (doc->badChars & BC_VENDOR_SPECIFIC_CHARS)
            TY_(Dialogue)( doc, TEXT_VENDOR_CHARS, encnam );

        if ((doc->badChars & BC_INVALID_SGML_CHARS) || (doc->badChars & BC_INVALID_NCR))
            TY_(Dialogue)( doc, TEXT_SGML_CHARS, encnam );

        if (doc->badChars & BC_INVALID_UTF8)
            TY_(Dialogue)( doc, TEXT_INVALID_UTF8 );

        if (doc->badChars & BC_INVALID_UTF16)
            TY_(Dialogue)( doc, TEXT_INVALID_UTF16 );

        if (doc->badChars & BC_INVALID_URI)
            TY_(Dialogue)( doc, TEXT_INVALID_URI );
    }
    
    if (doc->badForm)
    {
        if (doc->badForm & flg_BadForm) /* Issue #166 - changed to BIT flag to support other errors */
            TY_(Dialogue)( doc, TEXT_BAD_FORM );

        if (doc->badForm & flg_BadMain) /* Issue #166 - repeated <main> element */
            TY_(Dialogue)( doc, TEXT_BAD_MAIN );
    }

    if (doc->badAccess)
    {
        /* Tidy "classic" accessibility tests */
        if ( cfg(doc, TidyAccessibilityCheckLevel) == 0 )
        {
            if (doc->badAccess & BA_MISSING_SUMMARY)
                TY_(Dialogue)( doc, TEXT_M_SUMMARY );

            if (doc->badAccess & BA_MISSING_IMAGE_ALT)
                TY_(Dialogue)( doc, TEXT_M_IMAGE_ALT );

            if (doc->badAccess & BA_MISSING_IMAGE_MAP)
                TY_(Dialogue)( doc, TEXT_M_IMAGE_MAP );

            if (doc->badAccess & BA_MISSING_LINK_ALT)
                TY_(Dialogue)( doc, TEXT_M_LINK_ALT );

            if ((doc->badAccess & BA_USING_FRAMES) && !(doc->badAccess & BA_USING_NOFRAMES))
                TY_(Dialogue)( doc, TEXT_USING_FRAMES );
        }

        if ( cfg(doc, TidyAccessibilityCheckLevel) > 0 )
            TY_(Dialogue)( doc, TEXT_ACCESS_ADVICE2 );
        else
            TY_(Dialogue)( doc, TEXT_ACCESS_ADVICE1 );
    }

    if (doc->badLayout)
    {
        if (doc->badLayout & USING_LAYER)
            TY_(Dialogue)( doc, TEXT_USING_LAYER );

        if (doc->badLayout & USING_SPACER)
            TY_(Dialogue)( doc, TEXT_USING_SPACER );

        if (doc->badLayout & USING_FONT)
            TY_(Dialogue)( doc, TEXT_USING_FONT );

        if (doc->badLayout & USING_NOBR)
            TY_(Dialogue)( doc, TEXT_USING_NOBR );
        
        if (doc->badLayout & USING_BODY)
            TY_(Dialogue)( doc, TEXT_USING_BODY );
    }
    
    if (doc->footnotes)
    {
        if (doc->footnotes & FN_TRIM_EMPTY_ELEMENT)
            TY_(Dialogue)( doc, FOOTNOTE_TRIM_EMPTY_ELEMENT );
    }
}